

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerCallDirect(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  ushort callflags;
  Opnd *pOVar3;
  SymOpnd *pSVar4;
  StackSym *pSVar5;
  undefined4 *puVar6;
  Opnd *pOVar7;
  Instr *pIVar8;
  CallFlags flags;
  Instr *bailOutInstr;
  Opnd *funcObj;
  Instr *argInstr;
  StackSym *linkSym;
  Opnd *linkOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar3 = IR::Instr::UnlinkSrc2(instr);
  pSVar4 = IR::Opnd::AsSymOpnd(pOVar3);
  pSVar5 = Sym::AsStackSym(pSVar4->m_sym);
  pIVar8 = (pSVar5->field_5).m_instrDef;
  if (pIVar8->m_opcode != ArgOut_A_InlineSpecialized) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3002,"(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pOVar3 = IR::Instr::UnlinkSrc1(pIVar8);
  pOVar7 = IR::Instr::UnlinkSrc2(pIVar8);
  IR::Instr::SetSrc2(instr,pOVar7);
  IR::Instr::Remove(pIVar8);
  bVar2 = IR::Instr::HasBailOutInfo(instr);
  if ((bVar2) && (bVar2 = IR::Instr::HasLazyBailOut(instr), !bVar2)) {
    pIVar8 = SplitBailOnImplicitCall(this,instr,instr->m_next,instr->m_next);
    LowerBailOnEqualOrNotEqual
              (this,pIVar8,(BranchInstr *)0x0,(LabelInstr *)0x0,(PropertySymOpnd *)0x0,false);
  }
  pOVar7 = IR::Instr::GetDst(instr);
  callflags = 0x10;
  if (pOVar7 != (Opnd *)0x0) {
    callflags = 2;
  }
  pIVar8 = GenerateDirectCall(this,instr,pOVar3,callflags);
  return pIVar8;
}

Assistant:

IR::Instr *
Lowerer::LowerCallDirect(IR::Instr * instr)
{
    IR::Opnd* linkOpnd = instr->UnlinkSrc2();
    StackSym *linkSym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();
    IR::Instr* argInstr = linkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized);
    IR::Opnd* funcObj = argInstr->UnlinkSrc1();
    instr->SetSrc2(argInstr->UnlinkSrc2());
    argInstr->Remove();

    if (instr->HasBailOutInfo() && !instr->HasLazyBailOut())
    {
        IR::Instr * bailOutInstr = this->SplitBailOnImplicitCall(instr, instr->m_next, instr->m_next);
        this->LowerBailOnEqualOrNotEqual(bailOutInstr);
    }
    Js::CallFlags flags = instr->GetDst() ? Js::CallFlags_Value : Js::CallFlags_NotUsed;
    return this->GenerateDirectCall(instr, funcObj, (ushort)flags);
}